

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
SquareRootUnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (SquareRootUnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  bool *this_00;
  ComputationInfo CVar1;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_01;
  CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar6;
  Scalar *pSVar7;
  long row;
  AssertionResult *this_02;
  char *pcVar8;
  char *in_R9;
  long col;
  undefined1 local_23c [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  Vector<float,_2> mean;
  Scalar local_114;
  Scalar local_110;
  Scalar local_10c;
  Scalar local_108;
  Scalar local_104;
  Scalar local_100;
  Scalar local_fc;
  Scalar local_f8 [2];
  Matrix<T,_2,_2> Ssquared;
  Scalar local_e0 [2];
  Matrix<T,_3,_2> P_xy_ref;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S;
  Scalar local_a0;
  Scalar local_9c;
  Scalar local_98;
  float local_94;
  undefined1 local_90 [8];
  Matrix<T,_3,_2> K;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  Matrix<T,_3,_2> K_ref;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  AssertHelper local_38;
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_23c,1.0,2.0,1.0);
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ =
       (long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
              super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
              m_storage.m_data + 0x14;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
                      &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                       super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                       super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
                      P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                      .m_data.array + 4);
  local_90._0_4_ = 5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar2,(Scalar *)local_90);
  local_e0[0] = 5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar2,local_e0)
  ;
  local_70.ptr_._0_4_ = 0x40a00000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar2,(Scalar *)&local_70);
  local_f8[0] = 5.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar2,local_f8)
  ;
  local_50.data_._0_4_ = 0x40a00000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
            (pCVar2,(Scalar *)&local_50);
  this_00 = &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
             super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
             super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)this_00);
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_8_ =
       sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array + 0xd;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xd] = 2.0;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
       3.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
             &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
              super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
              super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
             P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
             array + 4);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)this_00);
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] = 1.4013e-45
  ;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_l1_norm = 1.4013e-45;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_isInitialized = false;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._21_3_ = 0;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._40_4_ = 0x3f800000;
  local_90._0_4_ = 2.0;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_
       = this_00;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)
                      (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                       m_storage.m_data.array + 4),(Scalar *)local_90);
  local_e0[0] = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar3,local_e0)
  ;
  local_70.ptr_._0_4_ = 0x3f800000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,(Scalar *)&local_70);
  local_f8[0] = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar3,local_f8)
  ;
  local_50.data_._0_4_ = 0x3f800000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,(Scalar *)&local_50);
  gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,(Scalar *)&gtest_ar.message_);
  local_38.data_._0_4_ = 0x40000000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,(Scalar *)&local_38);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 5);
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                             m_storage.m_data.array + 4);
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._28_4_ = 0x40000000;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,(Scalar *)
                             &S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.field_0x1c);
  local_a0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,&local_a0);
  local_9c = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                     (pCVar3,&local_9c);
  local_98 = 2.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar3,&local_98);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)
             (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
              array + 4));
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] = 1.4013e-45
  ;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] = 0.0;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_l1_norm = 1.4013e-45;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_isInitialized = false;
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._21_3_ = 0;
  local_f8[0] = 35.0;
  local_90._0_4_ = 0x42080000;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_
       = local_f8;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
                      (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                       m_storage.m_data.array + 4),(Scalar *)local_90);
  local_e0[0] = 34.0;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar4,local_e0)
  ;
  local_70.ptr_._0_4_ = 0x42380000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
            (pCVar4,(Scalar *)&local_70);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
             (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
              array + 4));
  S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.m_matrix.
  super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]._0_1_ = 0;
  Eigen::LLT<Eigen::Matrix<float,2,2,0,2,2>,1>::compute<Eigen::Matrix<float,2,2,0,2,2>>
            ((LLT<Eigen::Matrix<float,2,2,0,2,2>,1> *)
             (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
              array + 4),(EigenBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)local_f8);
  CVar1 = Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::info
                    ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)
                     (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                      .m_data.array + 4));
  this_02 = (AssertionResult *)&P_xy_ref;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] =
       0.0;
  P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] =
       0.0;
  local_e0[0] = (Scalar)CONCAT31(local_e0[0]._1_3_,CVar1 == Success);
  if (CVar1 == Success) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_02);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
    local_23c._0_4_ = 3.0;
    local_e0[0] = 5.0;
    local_90 = (undefined1  [8])local_23c;
    this_01 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_90,local_e0
                        );
    local_70.ptr_._0_4_ = 0x40e00000;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
              (this_01,(Scalar *)&local_70);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_90);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
    ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c.
    super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
    m_data.array[5] = 3.0;
    local_e0[0] = 5.0;
    local_90 = (undefined1  [8])
               ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_c
                       .super_Matrix<float,_7,_1>.
                       super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data
               + 0x14);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_90,local_e0)
    ;
    local_70.ptr_._0_4_ = 0x40400000;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)&local_70);
    local_50.data_._0_4_ = 0x40400000;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)&local_50);
    gtest_ar.message_.ptr_._0_4_ = 0x3f800000;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)&gtest_ar.message_);
    local_38.data_._0_4_ = 0x40400000;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)&local_38);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         3.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 5);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         5.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 4);
    S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>._28_4_ = 0x40e00000;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)
                               &S.super_LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>.field_0x1c);
    local_a0 = 7.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_a0);
    local_9c = 5.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_9c);
    local_98 = 3.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_98);
    mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
    m_storage.m_data.array[0] = 3.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,(Scalar *)&mean);
    mean.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
    m_storage.m_data.array[1] = 5.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,mean.super_Matrix<float,_2,_1>.
                               super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
                               .m_data.array + 1);
    local_114 = 7.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_114);
    local_110 = 11.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_110);
    local_10c = 9.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_10c);
    local_108 = 9.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_108);
    local_104 = 3.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_104);
    local_100 = 5.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_
                       (pCVar5,&local_100);
    local_fc = 5.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::operator_(pCVar5,&local_fc);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_7,_0,_3,_7>_> *)local_90);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
    local_e0[0] = 20.0;
    local_70.ptr_._0_4_ = 0x41a00000;
    local_90 = (undefined1  [8])local_e0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_90,
                        (Scalar *)&local_70);
    local_50.data_._0_4_ = 0x41a00000;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,(Scalar *)&local_50);
    gtest_ar.message_.ptr_._0_4_ = 0x42200000;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,(Scalar *)&gtest_ar.message_);
    local_38.data_._0_4_ = 0x42200000;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,(Scalar *)&local_38);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         60.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar6,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                      m_data.array + 5);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_90);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[0] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[1] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[2] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[3] = 0.0;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.4013e-45;
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] = 0.0;
    local_70.ptr_._0_4_ = 0x3f075495;
    local_50.data_._0_4_ = 0x3d3470c6;
    local_90 = (undefined1  [8])&local_70;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_90,
                        (Scalar *)&local_50);
    gtest_ar.message_.ptr_._0_4_ = 0xbf781b11;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,(Scalar *)&gtest_ar.message_);
    local_38.data_._0_4_ = 0x3fcafedf;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,(Scalar *)&local_38);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[5] =
         -0.44052863;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar6,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                               m_storage.m_data.array + 5);
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         1.6299559;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar6,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                      m_data.array + 4);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)local_90);
    Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
    computeKalmanGain<Kalman::Vector<float,_2>_>
              ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_23c,
               (Vector<float,_2> *)
               (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.
                m_data.array + 0xd),
               (SigmaPoints<Kalman::Vector<float,_2>_> *)
               &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized,
               (CovarianceSquareRoot<Kalman::Vector<float,_2>_> *)
               (P_xy_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                m_data.array + 4),(KalmanGain<Kalman::Vector<float,_2>_> *)local_90);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
    local_38.data_._0_4_ = 3;
    local_38.data_._4_4_ = 0;
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)&local_50,"K_ref.rows()","K.rows()",(long *)&gtest_ar.message_,
               (long *)&local_38);
    if (local_50.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0x91,pcVar8);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
      local_38.data_._0_4_ = 2;
      local_38.data_._4_4_ = 0;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)&local_50,"K_ref.cols()","K.cols()",(long *)&gtest_ar.message_,
                 (long *)&local_38);
      if (local_50.data_._0_1_ != (internal)0x0) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        row = 0;
        do {
          if (row == 3) {
            return;
          }
          for (col = 0; col != 2; col = col + 1) {
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)&local_70
                                ,row,col);
            local_94 = *pSVar7;
            pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_1> *)local_90,
                                row,col);
            testing::internal::DoubleNearPredFormat
                      ((internal *)&local_50,"K_ref(i,j)","K(i,j)","1e-6",(double)local_94,
                       (double)*pSVar7,1e-06);
            if (local_50.data_._0_1_ == (internal)0x0) {
              testing::Message::Message((Message *)&gtest_ar.message_);
              if (gtest_ar._0_8_ == 0) {
                pcVar8 = "";
              }
              else {
                pcVar8 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_38,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                         ,0x91,pcVar8);
              testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
              testing::internal::AssertHelper::~AssertHelper(&local_38);
              testing::internal::
              scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar.message_);
              this_02 = &gtest_ar;
              goto LAB_0019048c;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
          }
          row = row + 1;
        } while( true );
      }
      testing::Message::Message((Message *)&gtest_ar.message_);
      if (gtest_ar._0_8_ == 0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                 ,0x91,pcVar8);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&gtest_ar.message_);
    }
    this_02 = &gtest_ar;
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar.message_);
  }
  else {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_90,(internal *)local_e0,
               (AssertionResult *)"S.info() == Eigen::Success","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0x76,(char *)local_90);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_70);
  }
LAB_0019048c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_02);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename SquareRootUnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        35, 34,
        34, 46;
        
    Cholesky<Matrix<T,2,2>> S;
    S.compute(Ssquared);
    ASSERT_TRUE(S.info() == Eigen::Success);
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, S, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}